

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestInvalidValues(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  bool bVar3;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  size_t sStack_30;
  _Bool _result_15;
  size_t errorAtPos;
  JlDataObject *object;
  byte local_18;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  _Bool IsJson5_local;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  _result = IsJson5;
  WVar1 = VerifyJsonUnableToParse(IsJson5,"  StringWithNoQuotes",2);
  _result_8 = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert(_result_8,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  StringWithNoQuotes\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x437);
  if ((_result_8 & 1U) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if ((_result & 1U) == 0) {
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  +1234",2);
    _result_9 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_9,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  +1234\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43a);
    if ((_result_9 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  .1234",2);
    _result_10 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_10,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  .1234\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43b);
    if ((_result_10 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  1234.",2);
    _result_11 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_11,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  1234.\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43c);
    if ((_result_11 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  inf",2);
    _result_12 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_12,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43d);
    if ((_result_12 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  +inf",2);
    _result_13 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_13,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  +inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43e);
    if ((_result_13 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  -inf",2);
    _result_14 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(_result_14,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  -inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43f);
    if ((_result_14 & 1U) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  -nan",2);
    local_18 = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)local_18,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  -nan\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x440);
    if ((local_18 & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  1.2.3",2);
  object._7_1_ = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)object._7_1_,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  1.2.3\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x442);
  if ((object._7_1_ & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  $",2);
  object._6_1_ = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)object._6_1_,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  $\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x443);
  if ((object._6_1_ & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  <>",2);
  object._5_1_ = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)object._5_1_,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  <>\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x444);
  if ((object._5_1_ & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  !",2);
  object._4_1_ = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)object._4_1_,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  !\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x445);
  if ((object._4_1_ & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  # Comment",2);
  object._3_1_ = WVar1 == WJTL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)object._3_1_,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  # Comment\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x446);
  if ((object._3_1_ & 1) == 0) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if ((_result & 1U) == 0) {
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  // Comment",2);
    object._2_1_ = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)object._2_1_,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  // Comment\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x449);
    if ((object._2_1_ & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse((_Bool)(_result & 1),"  /* Comment */",2);
    object._1_1_ = WVar1 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)object._1_1_,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  /* Comment */\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x44a);
    if ((object._1_1_ & 1) == 0) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  errorAtPos = 0;
  sStack_30 = 100;
  JVar2 = JlParseJsonEx(anon_var_dwarf_39d + 10,(_Bool)(_result & 1),(JlDataObject **)&errorAtPos,
                        &stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar2 == JL_STATUS_END_OF_DATA,
                   "(JlParseJsonEx( \"\", IsJson5, &object, &errorAtPos )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x450);
  if (JVar2 != JL_STATUS_END_OF_DATA) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  bVar3 = errorAtPos == 0;
  WjTestLib_Assert(bVar3,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x451);
  if (!bVar3) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_30 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x452);
  if (!bVar3) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  JVar2 = JlParseJsonEx("    ",(_Bool)(_result & 1),(JlDataObject **)&errorAtPos,
                        &stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar2 == JL_STATUS_END_OF_DATA,
                   "(JlParseJsonEx( \"    \", IsJson5, &object, &errorAtPos )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x454);
  if (JVar2 != JL_STATUS_END_OF_DATA) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  bVar3 = errorAtPos == 0;
  WjTestLib_Assert(bVar3,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x455);
  if (!bVar3) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  bVar3 = sStack_30 == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x456);
  if (!bVar3) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestInvalidValues
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  StringWithNoQuotes", 2 ) );
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  +1234", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  .1234", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  1234.", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  +inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  -inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  -nan", 2 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  1.2.3", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  $", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  <>", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  !", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  # Comment", 2 ) );
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  // Comment", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  /* Comment */", 2 ) );
    }

    // Empty objects
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    JL_ASSERT_STATUS( JlParseJsonEx( "", IsJson5, &object, &errorAtPos ), JL_STATUS_END_OF_DATA );
    JL_ASSERT_NULL( object );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_STATUS( JlParseJsonEx( "    ", IsJson5, &object, &errorAtPos ), JL_STATUS_END_OF_DATA );
    JL_ASSERT_NULL( object );
    JL_ASSERT( 0 == errorAtPos );

    return TestReturn;
}